

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_document_struct *doc,xml_node_struct *root,void *contents,size_t size,uint options,
          xml_encoding encoding,bool is_mutable,bool own,char_t **out_buffer)

{
  bool bVar1;
  auto_deleter<void> *in_RCX;
  void *in_RDX;
  xml_node_struct *in_RSI;
  xml_parse_result *in_RDI;
  long in_R8;
  xml_document_struct *unaff_retaddr;
  size_t in_stack_00000008;
  byte in_stack_00000010;
  undefined7 in_stack_00000011;
  byte in_stack_00000018;
  undefined8 *in_stack_00000020;
  size_t length;
  char_t *buffer;
  auto_deleter<void> contents_guard;
  xml_encoding buffer_encoding;
  size_t in_stack_ffffffffffffff70;
  auto_deleter<void> *this;
  xml_encoding encoding_00;
  xml_parse_result *out_buffer_00;
  auto_deleter<void> local_40;
  xml_encoding local_2c;
  byte local_26;
  byte local_25;
  auto_deleter<void> *local_18;
  void *pvVar2;
  uint optmsk;
  xml_node_struct *root_00;
  
  local_25 = in_stack_00000010 & 1;
  local_26 = in_stack_00000018 & 1;
  if ((in_RCX == (auto_deleter<void> *)0x0) && (in_R8 != 0)) {
    make_parse_result((xml_parse_status)((ulong)in_RDX >> 0x20),0);
    out_buffer_00 = in_RDI;
  }
  else {
    out_buffer_00 = in_RDI;
    local_18 = in_RCX;
    pvVar2 = in_RDX;
    root_00 = in_RSI;
    local_2c = get_buffer_encoding((xml_encoding)in_RDX,in_RCX,in_stack_ffffffffffffff70);
    optmsk = (uint)((ulong)pvVar2 >> 0x20);
    encoding_00 = (xml_encoding)((ulong)in_RSI >> 0x20);
    this = local_18;
    if ((local_26 & 1) == 0) {
      this = (auto_deleter<void> *)0x0;
    }
    auto_deleter<void>::auto_deleter
              (&local_40,this,
               (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate);
    bVar1 = convert_buffer((char_t **)out_buffer_00,(size_t *)in_RDI,encoding_00,in_RDX,
                           (size_t)in_RCX,SUB81((ulong)this >> 0x38,0));
    if (bVar1) {
      auto_deleter<void>::release(&local_40);
      if ((((local_26 & 1) != 0) && (local_18 != (auto_deleter<void> *)0x0)) &&
         (local_18 != (auto_deleter<void> *)0x0)) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (local_18);
      }
      if (((local_26 & 1) != 0) || (local_18 != (auto_deleter<void> *)0x0)) {
        *in_stack_00000020 = 0;
      }
      root_00[1].value = (char_t *)0x0;
      xml_parser::parse((char_t *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000008,
                        unaff_retaddr,root_00,optmsk);
      in_RDI->encoding = local_2c;
    }
    else {
      make_parse_result((xml_parse_status)((ulong)in_RDX >> 0x20),(ptrdiff_t)in_RCX);
    }
    auto_deleter<void>::~auto_deleter(this);
  }
  return out_buffer_00;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : NULL, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = NULL;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}